

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

uint32 __thiscall userinfo_t::ColorChanged(userinfo_t *this,char *colorname)

{
  uint32 uVar1;
  FBaseCVar **ppFVar2;
  FName local_3c;
  FColorCVar *local_38;
  FColorCVar *local_30;
  UCVarValue val;
  FColorCVar *local_20;
  FColorCVar *color;
  char *colorname_local;
  userinfo_t *this_local;
  
  color = (FColorCVar *)colorname;
  colorname_local = (char *)this;
  FName::FName((FName *)((long)&val + 4),NAME_Color);
  ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,(FName *)((long)&val + 4));
  local_20 = (FColorCVar *)*ppFVar2;
  if (local_20 != (FColorCVar *)0x0) {
    local_30 = color;
    local_38 = color;
    FBaseCVar::SetGenericRep((FBaseCVar *)local_20,(UCVarValue)color,CVAR_String);
    FName::FName(&local_3c,NAME_ColorSet);
    ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                        (&this->
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         ,&local_3c);
    FIntCVar::operator=((FIntCVar *)*ppFVar2,-1);
    uVar1 = FColorCVar::operator_cast_to_unsigned_int(local_20);
    return uVar1;
  }
  __assert_fail("color != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_netinfo.cpp"
                ,0x1eb,"uint32 userinfo_t::ColorChanged(const char *)");
}

Assistant:

uint32 userinfo_t::ColorChanged(const char *colorname)
{
	FColorCVar *color = static_cast<FColorCVar *>((*this)[NAME_Color]);
	assert(color != NULL);
	UCVarValue val;
	val.String = const_cast<char *>(colorname);
	color->SetGenericRep(val, CVAR_String);
	*static_cast<FIntCVar *>((*this)[NAME_ColorSet]) = -1;
	return *color;
}